

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O3

void __thiscall
OpenMD::BondOrderParameter::writeOrderParameter
          (BondOrderParameter *this,vector<double,_std::allocator<double>_> *Q,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *What)

{
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *this_00;
  pointer pcVar1;
  undefined8 uVar2;
  char cVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  int l;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  int l_1;
  long lVar8;
  key_type kVar9;
  BondOrderParameter *pBVar10;
  Revision rev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  ofstream osw;
  ofstream osq;
  Revision local_469;
  string local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_448;
  BondOrderParameter *local_440;
  key_type local_438;
  undefined1 local_430 [8];
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420 [14];
  ios_base aiStack_338 [264];
  key_type local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  pcVar1 = (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p;
  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)What;
  local_438 = (key_type)Q;
  local_430 = (undefined1  [8])local_420;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_430,pcVar1,
             pcVar1 + (this->super_StaticAnalyser).outputFilename_._M_string_length);
  std::__cxx11::string::append((char *)local_430);
  std::ofstream::ofstream(&local_230,(char *)local_430,_S_out);
  if (local_430 != (undefined1  [8])local_420) {
    operator_delete((void *)local_430,local_420[0]._M_allocated_capacity + 1);
  }
  cVar3 = std::__basic_file<char>::is_open();
  local_440 = this;
  if (cVar3 == '\0') {
    pcVar1 = (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p;
    local_430 = (undefined1  [8])local_420;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_430,pcVar1,
               pcVar1 + (this->super_StaticAnalyser).outputFilename_._M_string_length);
    std::__cxx11::string::append(local_430);
    snprintf(painCave.errMsg,2000,"BondOrderParameter: unable to open %s\n",local_430);
    if (local_430 != (undefined1  [8])local_420) {
      operator_delete((void *)local_430,local_420[0]._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_StaticAnalyser).analysisType_._M_dataplus._M_p,
                        (this->super_StaticAnalyser).analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_((string *)local_430,&local_469);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(char *)local_430,local_428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (local_430 != (undefined1  [8])local_420) {
      operator_delete((void *)local_430,local_420[0]._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    Revision::getBuildDate_abi_cxx11_((string *)local_430,&local_469);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(char *)local_430,local_428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (local_430 != (undefined1  [8])local_420) {
      operator_delete((void *)local_430,local_420[0]._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# selection script: \"",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# parameters: ",0xe)
      ;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,
                          (this->super_StaticAnalyser).paramString_._M_dataplus._M_p,
                          (this->super_StaticAnalyser).paramString_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
    lVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# <Q_",5);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)lVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,">: ",3);
      poVar4 = std::ostream::_M_insert<double>(*(double *)(*(size_type *)local_438 + lVar6 * 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xd);
    if (0 < this->nBins_) {
      this_00 = &this->Q_histogram_;
      kVar9.first = 0;
      kVar9.second = 0;
      do {
        std::ostream::_M_insert<double>(((double)kVar9.first + 0.5) * this->deltaQ_ + this->MinQ_);
        lVar6 = 0;
        local_438 = kVar9;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          local_430 = (undefined1  [8])kVar9;
          pmVar5 = std::
                   map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                   ::operator[](this_00,(key_type *)local_430);
          std::ostream::_M_insert<double>
                    (((double)*pmVar5 /
                     (double)(local_440->Qcount_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar6]) / local_440->deltaQ_);
          lVar6 = lVar6 + 1;
          kVar9 = (key_type)((long)kVar9 + 0x100000000);
        } while (lVar6 != 0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        kVar9 = (key_type)((long)local_438 + 1);
        this = local_440;
      } while ((long)kVar9 < (long)local_440->nBins_);
    }
    std::ofstream::close();
  }
  paVar7 = &local_468.field_2;
  pcVar1 = (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p;
  local_468._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_468,pcVar1,
             pcVar1 + (this->super_StaticAnalyser).outputFilename_._M_string_length);
  std::__cxx11::string::append((char *)&local_468);
  std::ofstream::ofstream(local_430,local_468._M_dataplus._M_p,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar7) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    pcVar1 = (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p;
    local_468._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_468,pcVar1,
               pcVar1 + (this->super_StaticAnalyser).outputFilename_._M_string_length);
    std::__cxx11::string::append((char *)&local_468);
    snprintf(painCave.errMsg,2000,"BondOrderParameter: unable to open %s\n",
             local_468._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != paVar7) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"# ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_430,
                        (this->super_StaticAnalyser).analysisType_._M_dataplus._M_p,
                        (this->super_StaticAnalyser).analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_468,&local_469);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_430,local_468._M_dataplus._M_p,local_468._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != paVar7) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_468,&local_469);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_430,local_468._M_dataplus._M_p,local_468._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != paVar7) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_430,"# selection script: \"",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_430,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"# parameters: ",0xe);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_430,
                          (this->super_StaticAnalyser).paramString_._M_dataplus._M_p,
                          (this->super_StaticAnalyser).paramString_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
    lVar6 = 0;
    lVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"# <W_",5);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_430,(int)lVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,">: ",3);
      poVar4 = std::ostream::_M_insert<double>
                         (*(double *)(local_448->_M_allocated_capacity + lVar6));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      poVar4 = std::ostream::_M_insert<double>
                         (*(double *)(local_448->_M_allocated_capacity + 8 + lVar6));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar8 != 0xd);
    if (0 < this->nBins_) {
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
      pBVar10 = this;
      do {
        std::ostream::_M_insert<double>
                  (((double)(int)paVar7 + 0.5) * pBVar10->deltaW_ + pBVar10->MinW_);
        lVar6 = 0;
        local_448 = paVar7;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"\t",1);
          local_468._M_dataplus._M_p = (pointer)paVar7;
          pmVar5 = std::
                   map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                   ::operator[](&this->W_histogram_,(key_type *)&local_468);
          std::ostream::_M_insert<double>
                    (((double)*pmVar5 /
                     (double)(local_440->Wcount_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar6]) / local_440->deltaW_);
          lVar6 = lVar6 + 1;
          paVar7 = paVar7 + 0x10000000;
        } while (lVar6 != 0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"\n",1);
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)&local_448->_M_allocated_capacity + 1);
        pBVar10 = local_440;
      } while ((long)paVar7 < (long)local_440->nBins_);
    }
    std::ofstream::close();
  }
  uVar2 = ___throw_bad_array_new_length;
  kVar9 = _VTT;
  local_430._0_4_ = _VTT;
  local_430._4_4_ = std::ofstream::VTT_4;
  *(undefined8 *)(local_430 + *(long *)((long)_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_428);
  std::ios_base::~ios_base(aiStack_338);
  local_230 = kVar9;
  *(undefined8 *)(local_228 + *(long *)((long)kVar9 + -0x18) + -8) = uVar2;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  return;
}

Assistant:

void BondOrderParameter::writeOrderParameter(std::vector<RealType> Q,
                                               std::vector<ComplexType> What) {
    Revision rev;
    std::ofstream osq((getOutputFileName() + "q").c_str());

    if (osq.is_open()) {
      osq << "# " << getAnalysisType() << "\n";
      osq << "# OpenMD " << rev.getFullRevision() << "\n";
      osq << "# " << rev.getBuildDate() << "\n";
      osq << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osq << "# parameters: " << paramString_ << "\n";

      for (int l = 0; l <= lMax_; l++) {
        osq << "# <Q_" << l << ">: " << Q[l] << "\n";
      }
      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        RealType Qval = MinQ_ + (i + 0.5) * deltaQ_;
        osq << Qval;
        for (int l = 0; l <= lMax_; l++) {
          osq << "\t"
              << (RealType)Q_histogram_[std::make_pair(i, l)] /
                     (RealType)Qcount_[l] / deltaQ_;
        }
        osq << "\n";
      }

      osq.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondOrderParameter: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }

    std::ofstream osw((getOutputFileName() + "w").c_str());

    if (osw.is_open()) {
      osw << "# " << getAnalysisType() << "\n";
      osw << "# OpenMD " << rev.getFullRevision() << "\n";
      osw << "# " << rev.getBuildDate() << "\n";
      osw << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osw << "# parameters: " << paramString_ << "\n";

      for (int l = 0; l <= lMax_; l++) {
        osw << "# <W_" << l << ">: " << real(What[l]) << "\t" << imag(What[l])
            << "\n";
      }
      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        RealType Wval = MinW_ + (i + 0.5) * deltaW_;
        osw << Wval;
        for (int l = 0; l <= lMax_; l++) {
          osw << "\t"
              << (RealType)W_histogram_[std::make_pair(i, l)] /
                     (RealType)Wcount_[l] / deltaW_;
        }
        osw << "\n";
      }

      osw.close();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondOrderParameter: unable to open %s\n",
               (getOutputFileName() + "w").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }